

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O3

bool __thiscall
ByteCodeGenerator::CanStackNestedFunc(ByteCodeGenerator *this,FuncInfo *funcInfo,bool trace)

{
  byte bVar1;
  NestedArray *pNVar2;
  code *pcVar3;
  bool bVar4;
  uint uVar5;
  LocalFunctionId LVar6;
  int iVar7;
  undefined4 *puVar8;
  FunctionInfo *pFVar9;
  undefined4 extraout_var;
  char16 *pcVar11;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  char16_t *form;
  ParseableFunctionInfo *pPVar12;
  wchar local_88 [4];
  char16 debugStringBuffer [42];
  undefined8 uVar10;
  
  bVar4 = FuncInfo::IsGlobalFunction(funcInfo);
  if (bVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                       ,0x754,"(!funcInfo->IsGlobalFunction())","!funcInfo->IsGlobalFunction()");
    if (!bVar4) goto LAB_0082420e;
    *puVar8 = 0;
  }
  if (((funcInfo->field_0xb5 & 0x20) != 0) ||
     (bVar1 = this->m_utf8SourceInfo->field_0xa8,
     (byte)((bVar1 >> 5 | (this->m_utf8SourceInfo->debugModeSource).ptr != (uchar *)0x0) &
           (bVar1 & 0x40) >> 6) != 0)) {
    return false;
  }
  pPVar12 = funcInfo->byteCodeFunction;
  pFVar9 = (pPVar12->super_FunctionProxy).functionInfo.ptr;
  if (pFVar9 == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                       ,0x50d,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar4) goto LAB_0082420e;
    *puVar8 = 0;
    pFVar9 = (pPVar12->super_FunctionProxy).functionInfo.ptr;
  }
  if ((ParseableFunctionInfo *)(pFVar9->functionBodyImpl).ptr != pPVar12) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                       ,0x50e,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                       "GetFunctionInfo()->GetFunctionProxy() == this");
    if (!bVar4) goto LAB_0082420e;
    *puVar8 = 0;
    pFVar9 = (pPVar12->super_FunctionProxy).functionInfo.ptr;
  }
  if ((pFVar9->attributes & (Async|Generator)) != None) {
    return false;
  }
  pPVar12 = funcInfo->byteCodeFunction;
  pFVar9 = (pPVar12->super_FunctionProxy).functionInfo.ptr;
  if (pFVar9 == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                       ,0x57d,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar4) goto LAB_0082420e;
    *puVar8 = 0;
    pFVar9 = (pPVar12->super_FunctionProxy).functionInfo.ptr;
  }
  if ((ParseableFunctionInfo *)(pFVar9->functionBodyImpl).ptr != pPVar12) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                       ,0x57e,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                       "GetFunctionInfo()->GetFunctionProxy() == this");
    if (!bVar4) {
LAB_0082420e:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar8 = 0;
    pFVar9 = (pPVar12->super_FunctionProxy).functionInfo.ptr;
  }
  if ((pFVar9->attributes & Module) != None) {
    return false;
  }
  bVar4 = Js::ScriptContext::ExceedsStackNestedFuncCount(funcInfo->root->nestedCount);
  if (bVar4) {
    return false;
  }
  if ((*(uint *)&funcInfo->field_0xb4 & 6) == 0) {
    if ((((funcInfo->bodyScope->field_0x44 & 2) == 0) &&
        ((funcInfo->paramScope->field_0x44 & 2) == 0)) &&
       ((funcInfo->funcExprScope == (Scope *)0x0 || ((funcInfo->funcExprScope->field_0x44 & 2) == 0)
        ))) {
      if ((short)*(uint *)&funcInfo->field_0xb4 < 0) {
        pPVar12 = funcInfo->byteCodeFunction;
        if (((trace) && (pNVar2 = (pPVar12->nestedArray).ptr, pNVar2 != (NestedArray *)0x0)) &&
           (pNVar2->nestedCount != 0)) {
          uVar5 = Js::FunctionProxy::GetSourceContextId(&pPVar12->super_FunctionProxy);
          LVar6 = Js::FunctionProxy::GetLocalFunctionId
                            (&funcInfo->byteCodeFunction->super_FunctionProxy);
          bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015bc490,StackFuncPhase,uVar5,LVar6);
          pPVar12 = funcInfo->byteCodeFunction;
          if (bVar4) {
            iVar7 = (*(pPVar12->super_FunctionProxy).super_FinalizableObject.
                      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])();
            pcVar11 = Js::FunctionProxy::GetDebugNumberSet
                                (&funcInfo->byteCodeFunction->super_FunctionProxy,
                                 (wchar (*) [42])local_88);
            Output::Print(L"DoStackNestedFunc: %s (function %s)\n",CONCAT44(extraout_var_02,iVar7),
                          pcVar11);
            Output::Flush();
            pPVar12 = funcInfo->byteCodeFunction;
          }
        }
        uVar5 = Js::FunctionProxy::GetSourceContextId(&pPVar12->super_FunctionProxy);
        LVar6 = Js::FunctionProxy::GetLocalFunctionId
                          (&funcInfo->byteCodeFunction->super_FunctionProxy);
        bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015a4e90,StackFuncPhase,uVar5,LVar6);
        return !bVar4;
      }
      if (!trace) {
        return false;
      }
      uVar5 = Js::FunctionProxy::GetSourceContextId
                        (&funcInfo->byteCodeFunction->super_FunctionProxy);
      LVar6 = Js::FunctionProxy::GetLocalFunctionId
                        (&funcInfo->byteCodeFunction->super_FunctionProxy);
      bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015bc490,StackFuncPhase,uVar5,LVar6);
      if (!bVar4) {
        return false;
      }
      iVar7 = (*(funcInfo->byteCodeFunction->super_FunctionProxy).super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])();
      Output::Print(L"CanStackNestedFunc: %s (Split Scope)\n",CONCAT44(extraout_var_00,iVar7));
      goto LAB_00824129;
    }
    if (!trace) {
      return false;
    }
    uVar5 = Js::FunctionProxy::GetSourceContextId(&funcInfo->byteCodeFunction->super_FunctionProxy);
    LVar6 = Js::FunctionProxy::GetLocalFunctionId(&funcInfo->byteCodeFunction->super_FunctionProxy);
    bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015bc490,StackFuncPhase,uVar5,LVar6);
    if (!bVar4) {
      return false;
    }
    iVar7 = (*(funcInfo->byteCodeFunction->super_FunctionProxy).super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])();
    uVar10 = CONCAT44(extraout_var_01,iVar7);
    pcVar11 = Js::FunctionProxy::GetDebugNumberSet
                        (&funcInfo->byteCodeFunction->super_FunctionProxy,(wchar (*) [42])local_88);
    form = L"HasMaybeEscapedNestedFunc (ObjectScope): %s (function %s)\n";
  }
  else {
    if (!trace) {
      return false;
    }
    uVar5 = Js::FunctionProxy::GetSourceContextId(&funcInfo->byteCodeFunction->super_FunctionProxy);
    LVar6 = Js::FunctionProxy::GetLocalFunctionId(&funcInfo->byteCodeFunction->super_FunctionProxy);
    bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015bc490,StackFuncPhase,uVar5,LVar6);
    if (!bVar4) {
      return false;
    }
    iVar7 = (*(funcInfo->byteCodeFunction->super_FunctionProxy).super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])();
    uVar10 = CONCAT44(extraout_var,iVar7);
    pcVar11 = Js::FunctionProxy::GetDebugNumberSet
                        (&funcInfo->byteCodeFunction->super_FunctionProxy,(wchar (*) [42])local_88);
    form = L"HasMaybeEscapedNestedFunc (Eval): %s (function %s)\n";
  }
  Output::Print(form,uVar10,pcVar11);
LAB_00824129:
  Output::Flush();
  return false;
}

Assistant:

bool ByteCodeGenerator::CanStackNestedFunc(FuncInfo * funcInfo, bool trace)
{
#if ENABLE_DEBUG_CONFIG_OPTIONS
    char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
#endif
    Assert(!funcInfo->IsGlobalFunction());
    bool const doStackNestedFunc = !funcInfo->HasMaybeEscapedNestedFunc() && !IsInDebugMode()
        && !funcInfo->byteCodeFunction->IsCoroutine()
        && !funcInfo->byteCodeFunction->IsModule()
        && !Js::ScriptContext::ExceedsStackNestedFuncCount(funcInfo->root->nestedCount);
    if (!doStackNestedFunc)
    {
        return false;
    }

    bool callsEval = funcInfo->GetCallsEval() || funcInfo->GetChildCallsEval();
    if (callsEval)
    {
        if (trace)
        {
            PHASE_PRINT_TESTTRACE(Js::StackFuncPhase, funcInfo->byteCodeFunction,
                _u("HasMaybeEscapedNestedFunc (Eval): %s (function %s)\n"),
                funcInfo->byteCodeFunction->GetDisplayName(),
                funcInfo->byteCodeFunction->GetDebugNumberSet(debugStringBuffer));
        }
        return false;
    }

    if (funcInfo->GetBodyScope()->GetIsObject() || funcInfo->GetParamScope()->GetIsObject() || (funcInfo->GetFuncExprScope() && funcInfo->GetFuncExprScope()->GetIsObject()))
    {
        if (trace)
        {
            PHASE_PRINT_TESTTRACE(Js::StackFuncPhase, funcInfo->byteCodeFunction,
                _u("HasMaybeEscapedNestedFunc (ObjectScope): %s (function %s)\n"),
                funcInfo->byteCodeFunction->GetDisplayName(),
                funcInfo->byteCodeFunction->GetDebugNumberSet(debugStringBuffer));
        }
        return false;
    }

    if (!funcInfo->IsBodyAndParamScopeMerged())
    {
        if (trace)
        {
            PHASE_PRINT_TESTTRACE(Js::StackFuncPhase, funcInfo->byteCodeFunction,
                _u("CanStackNestedFunc: %s (Split Scope)\n"),
                funcInfo->byteCodeFunction->GetDisplayName());
        }
        return false;
    }

    if (trace && funcInfo->byteCodeFunction->GetNestedCount())
    {
        // Only print functions that actually have nested functions, although we will still mark
        // functions that don't have nested child functions as DoStackNestedFunc.
        PHASE_PRINT_TESTTRACE(Js::StackFuncPhase, funcInfo->byteCodeFunction,
            _u("DoStackNestedFunc: %s (function %s)\n"),
            funcInfo->byteCodeFunction->GetDisplayName(),
            funcInfo->byteCodeFunction->GetDebugNumberSet(debugStringBuffer));
    }

    return !PHASE_OFF(Js::StackFuncPhase, funcInfo->byteCodeFunction);
}